

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_filter.cpp
# Opt level: O3

ScalarFunction * duckdb::ListFilterFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_e9;
  code *local_e8;
  undefined8 local_e0;
  code *local_d8;
  code *local_d0;
  LogicalType local_c8 [24];
  LogicalType local_b0 [24];
  LogicalType local_98 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_80;
  LogicalType local_68 [24];
  LogicalType local_50 [24];
  LogicalType local_38 [24];
  
  duckdb::LogicalType::LogicalType(local_c8,ANY);
  duckdb::LogicalType::LIST(local_50);
  duckdb::LogicalType::LogicalType(local_38,LAMBDA);
  __l._M_len = 2;
  __l._M_array = local_50;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_80,__l,&local_e9);
  duckdb::LogicalType::LogicalType(local_b0,ANY);
  duckdb::LogicalType::LIST(local_98);
  local_e0 = 0;
  local_e8 = LambdaFunctions::ListFilterFunction;
  local_d0 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  duckdb::LogicalType::LogicalType(local_68,INVALID);
  duckdb::ScalarFunction::ScalarFunction();
  duckdb::LogicalType::~LogicalType(local_68);
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,3);
  }
  duckdb::LogicalType::~LogicalType(local_98);
  duckdb::LogicalType::~LogicalType(local_b0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_80);
  lVar1 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_50 + lVar1);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  duckdb::LogicalType::~LogicalType(local_c8);
  in_RDI->field_0xa9 = 1;
  in_RDI->serialize = ListLambdaBindData::Serialize;
  in_RDI->deserialize = ListLambdaBindData::Deserialize;
  in_RDI->bind_lambda = ListFilterBindLambda;
  return in_RDI;
}

Assistant:

ScalarFunction ListFilterFun::GetFunction() {
	ScalarFunction fun({LogicalType::LIST(LogicalType::ANY), LogicalType::LAMBDA}, LogicalType::LIST(LogicalType::ANY),
	                   LambdaFunctions::ListFilterFunction, ListFilterBind, nullptr, nullptr);

	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	fun.serialize = ListLambdaBindData::Serialize;
	fun.deserialize = ListLambdaBindData::Deserialize;
	fun.bind_lambda = ListFilterBindLambda;

	return fun;
}